

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O2

int __thiscall
TPZPlane::SetPlane(TPZPlane *this,TPZVec<double> *p1,TPZVec<double> *p2,TPZVec<double> *p3)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  REAL *pRVar10;
  long lVar11;
  double dVar12;
  REAL RVar13;
  REAL RVar14;
  REAL RVar15;
  REAL matrix [3] [3];
  TPZVec<double> aux;
  REAL sol [3];
  int ordem [3];
  TPZVec<double> desloc2;
  TPZVec<double> desloc1;
  REAL matrix2 [3] [3];
  
  TPZVec<double>::TPZVec(&desloc1,3);
  TPZVec<double>::TPZVec(&desloc2,3);
  TPZVec<double>::TPZVec(&aux,3);
  pdVar1 = p1->fStore;
  pdVar2 = p2->fStore;
  pdVar3 = p3->fStore;
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    desloc1.fStore[lVar11] = pdVar1[lVar11] - pdVar2[lVar11];
    desloc2.fStore[lVar11] = pdVar2[lVar11] - pdVar3[lVar11];
  }
  TPZNumeric::ProdVetorial<double>(&desloc1,&desloc2,&aux);
  dVar12 = 0.0;
  for (lVar11 = 0; lVar11 != 0x18; lVar11 = lVar11 + 8) {
    dVar12 = dVar12 + *(double *)((long)aux.fStore + lVar11) *
                      *(double *)((long)aux.fStore + lVar11);
  }
  if (dVar12 <= 1e-10) {
    iVar7 = 0;
    std::operator<<((ostream *)&std::cerr,
                    "TPZPlane::SetPlane - Error: Colinear points can\'t define a single plane\n");
  }
  else {
    pdVar1 = p1->fStore;
    pdVar2 = p2->fStore;
    pdVar3 = p3->fStore;
    pRVar10 = matrix[0] + 2;
    lVar11 = 0;
    while (lVar11 != 3) {
      matrix[0][0] = pdVar1[lVar11];
      lVar4 = 0;
      if (lVar11 != 2) {
        lVar4 = lVar11 + 1;
      }
      matrix[0][1] = pdVar1[lVar4];
      matrix[1][0] = pdVar2[lVar11];
      matrix[1][1] = pdVar2[lVar4];
      matrix[2][0] = pdVar3[lVar11];
      matrix[2][1] = pdVar3[lVar4];
      *pRVar10 = 1.0;
      RVar13 = MatrixDet(matrix);
      aux.fStore[lVar11] = RVar13;
      pRVar10 = pRVar10 + 3;
      lVar11 = lVar11 + 1;
    }
    TPZNumeric::SortArray3<double>(&aux,ordem);
    iVar7 = ordem[0] % 3;
    pdVar1 = p1->fStore;
    matrix[0][0] = pdVar1[iVar7];
    iVar8 = (ordem[0] + 1) % 3;
    matrix[0][1] = pdVar1[iVar8];
    pdVar2 = p2->fStore;
    matrix[1][0] = pdVar2[iVar7];
    matrix[1][1] = pdVar2[iVar8];
    matrix[2][0] = p3->fStore[iVar7];
    matrix[2][1] = p3->fStore[iVar8];
    iVar9 = (ordem[0] + 2) % 3;
    RVar13 = pdVar1[iVar9];
    dVar12 = pdVar2[iVar9];
    RVar14 = MatrixDet(matrix);
    lVar11 = 0;
    while (lVar11 != 3) {
      matrix2[0][lVar11] = -RVar13;
      matrix2[1][lVar11] = -dVar12;
      matrix2[2][lVar11] = -dVar12;
      lVar4 = lVar11 + 1;
      lVar5 = 0;
      if (lVar4 != 3) {
        lVar5 = lVar4;
      }
      RVar15 = matrix[1][lVar5];
      matrix2[0][lVar5] = matrix[0][lVar5];
      matrix2[1][lVar5] = RVar15;
      matrix2[2][lVar5] = matrix[2][lVar5];
      uVar6 = (ulong)((int)lVar11 - 1);
      if (lVar4 == 1) {
        uVar6 = 2;
      }
      RVar15 = matrix[1][uVar6];
      matrix2[0][uVar6] = matrix[0][uVar6];
      matrix2[1][uVar6] = RVar15;
      matrix2[2][uVar6] = matrix[2][uVar6];
      RVar15 = MatrixDet(matrix2);
      sol[lVar11] = RVar15 / RVar14;
      lVar11 = lVar4;
    }
    pdVar1 = (this->fCoef).fStore;
    pdVar1[iVar7] = sol[0];
    pdVar1[iVar8] = sol[1];
    pdVar1[iVar9] = 1.0;
    pdVar1[3] = sol[2];
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar7 = 1;
  }
  TPZVec<double>::~TPZVec(&aux);
  TPZVec<double>::~TPZVec(&desloc2);
  TPZVec<double>::~TPZVec(&desloc1);
  return iVar7;
}

Assistant:

int TPZPlane::SetPlane(const TPZVec<REAL> &p1, const TPZVec<REAL> &p2,const TPZVec<REAL> &p3){
	REAL matrix[3][3];
	TPZVec<REAL> desloc1(3), desloc2(3);
	TPZVec<REAL> aux(3);
	int i ;
	
	for(i=0; i<3;i++){
		desloc1[i] = p1[i]- p2[i];
		desloc2[i] = p2[i]-p3[i];
	}  
	TPZNumeric::ProdVetorial(desloc1, desloc2, aux);
	REAL norm = inner_product(&aux[0], &aux[3], &aux[0], REAL(0.0));
	if(norm <= 1e-10){
		cerr << "TPZPlane::SetPlane - Error: Colinear points can't define a single plane\n";
		return 0;
	}
	else{
		for(i=0; i<3;i++){
			matrix[0][0]=p1[i%3];
			matrix[0][1]=p1[(i+1)%3];
			matrix[1][0]=p2[i%3];
			matrix[1][1]=p2[(i+1)%3];
			matrix[2][0]=p3[i%3];
			matrix[2][1]=p3[(i+1)%3];
			matrix[i][2]=1.0;
			MatrixDet(matrix, aux[i]);
		}
		
		int ordem[3];
		REAL vect[3];
		TPZNumeric::SortArray3(aux,ordem);
		i=ordem[0];
		
		matrix[0][0]=p1[i%3];
		matrix[0][1]=p1[(i+1)%3];
		matrix[1][0]=p2[i%3];
		matrix[1][1]=p2[(i+1)%3];
		matrix[2][0]=p3[i%3];
		matrix[2][1]=p3[(i+1)%3];
		vect[0]=-p1[(i+2)%3];
		vect[1]=-p2[(i+2)%3];
		vect[2]=-p2[(i+2)%3];
		
		REAL matrix2[3][3];
		REAL sol[3];
		
		for(i=0; i<3;i++){
			matrix2[0][i%3]=vect[0];
			matrix2[1][i%3]=vect[1];
			matrix2[2][i%3]=vect[2];
			matrix2[0][(i+1)%3]=matrix[0][(i+1)%3];
			matrix2[1][(i+1)%3]=matrix[1][(i+1)%3];
			matrix2[2][(i+1)%3]=matrix[2][(i+1)%3];
			matrix2[0][(i+2)%3]=matrix[0][(i+2)%3];
			matrix2[1][(i+2)%3]=matrix[1][(i+2)%3];
			matrix2[2][(i+2)%3]=matrix[2][(i+2)%3];
			
			sol[i]=MatrixDet(matrix2)/MatrixDet(matrix);
		}
		fCoef[(ordem[0])%3]=sol[0];
		fCoef[(ordem[0]+1)%3]=sol[1];
		fCoef[(ordem[0]+2)%3]= 1.0;
		fCoef[3]=sol[2];
	}
	cout <<endl;
	return 1;	
}